

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O3

Vec_Int_t * Llb_DriverCountRefs(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  long lVar7;
  long lVar8;
  
  iVar1 = p->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  lVar7 = (long)p->nRegs;
  if (0 < lVar7) {
    pVVar3 = p->vCos;
    iVar5 = p->nTruePos;
    lVar8 = (long)iVar5;
    do {
      if ((iVar5 < 0) || (pVVar3->nSize <= lVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = *(ulong *)((long)pVVar3->pArray[lVar8] + 8);
      if (uVar4 == 0) {
LAB_007d8bec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      iVar2 = *(int *)((uVar4 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_007d8bec;
      __s[iVar2] = __s[iVar2] + 1;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return pVVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// driver issue:arises when creating
// - driver ref-counter array
// - Ns2Glo maps
// - final partition
// - change-phase cube

// LI variable is used when
// - driver drives more than one LI
// - driver is a PI
// - driver is a constant

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of times each flop driver is referenced.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Llb_DriverCountRefs( Aig_Man_t * p )
{
    Vec_Int_t * vCounts;
    Aig_Obj_t * pObj;
    int i;
    vCounts = Vec_IntStart( Aig_ManObjNumMax(p) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntAddToEntry( vCounts, Aig_ObjFaninId0(pObj), 1 );
    return vCounts;
}